

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_array_ref.hpp
# Opt level: O2

void __thiscall
boost::
const_multi_array_ref<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>**>
::init_multi_array_ref<long*>
          (const_multi_array_ref<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>**>
           *this,long *extents_iter)

{
  const_multi_array_ref<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>**>
  *extent_list;
  const_multi_array_ref<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>**>
  *stride_list;
  general_storage_order<2UL> *storage;
  index iVar1;
  
  extent_list = this + 0x20;
  detail::multi_array::copy_n<long*,unsigned_long,unsigned_long*>
            (extents_iter,2,(unsigned_long *)extent_list);
  stride_list = this + 0x30;
  storage = (general_storage_order<2UL> *)(this + 8);
  *(long *)(this + 0x60) = *(long *)(this + 0x28) * *(long *)(this + 0x20);
  detail::multi_array::
  multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul>
  ::compute_strides<boost::array<long,2ul>,boost::array<unsigned_long,2ul>>
            ((multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul>
              *)this,(array<long,_2UL> *)stride_list,(array<unsigned_long,_2UL> *)extent_list,
             storage);
  iVar1 = detail::multi_array::
          multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul>
          ::
          calculate_origin_offset<boost::array<long,2ul>,boost::array<unsigned_long,2ul>,boost::array<long,2ul>>
                    ((multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul>
                      *)this,(array<long,_2UL> *)stride_list,
                     (array<unsigned_long,_2UL> *)extent_list,storage,
                     (array<long,_2UL> *)(this + 0x40));
  *(index *)(this + 0x50) = iVar1;
  iVar1 = detail::multi_array::
          multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul>
          ::
          calculate_descending_dimension_offset<boost::array<long,2ul>,boost::array<unsigned_long,2ul>>
                    ((multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul>
                      *)this,(array<long,_2UL> *)stride_list,
                     (array<unsigned_long,_2UL> *)extent_list,storage);
  *(index *)(this + 0x58) = iVar1;
  return;
}

Assistant:

void init_multi_array_ref(InputIterator extents_iter) {
    boost::function_requires<InputIteratorConcept<InputIterator> >();

    boost::detail::multi_array::
      copy_n(extents_iter,num_dimensions(),extent_list_.begin());

    // Calculate the array size
    num_elements_ = std::accumulate(extent_list_.begin(),extent_list_.end(),
                            size_type(1),std::multiplies<size_type>());

    this->compute_strides(stride_list_,extent_list_,storage_);

    origin_offset_ =
      this->calculate_origin_offset(stride_list_,extent_list_,
                              storage_,index_base_list_);
    directional_offset_ =
      this->calculate_descending_dimension_offset(stride_list_,extent_list_,
                                            storage_);
  }